

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_char,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  byte local_3d;
  undefined1 auStack_3c [7];
  u8 i;
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  uint amount;
  BinopFunc<unsigned_char,_unsigned_char> *f_local;
  Thread *this_local;
  
  uVar2 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  for (local_3d = 0; local_3d < 0x10; local_3d = local_3d + 1) {
    puVar3 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(result.v + 8),local_3d);
    uVar1 = (*f)(*puVar3,(uchar)uVar2);
    puVar3 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)auStack_3c,local_3d);
    *puVar3 = uVar1;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = auStack_3c[0];
  value.v[1] = auStack_3c[1];
  value.v[2] = auStack_3c[2];
  value.v[3] = auStack_3c[3];
  value.v[4] = auStack_3c[4];
  value.v[5] = auStack_3c[5];
  value.v[6] = auStack_3c[6];
  value.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}